

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qprocess_p.h
# Opt level: O0

QString * __thiscall QProcEnvValue::string(QProcEnvValue *this)

{
  long lVar1;
  bool bVar2;
  QString *in_RDI;
  long in_FS_OFFSET;
  QString *this_00;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = in_RDI;
  bVar2 = QString::isEmpty((QString *)0x796eaf);
  if ((bVar2) && (bVar2 = QByteArray::isEmpty((QByteArray *)0x796ebf), !bVar2)) {
    QString::fromLocal8Bit<void>((QByteArray *)this_00);
    QString::operator=(this_00,in_RDI);
    QString::~QString((QString *)0x796eef);
  }
  QString::QString(this_00,in_RDI);
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return this_00;
}

Assistant:

QString string() const
    {
        if (stringValue.isEmpty() && !byteValue.isEmpty())
            stringValue = QString::fromLocal8Bit(byteValue);
        return stringValue;
    }